

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdb.c
# Opt level: O0

int mdb_dbi_open(MDB_txn *txn,char *name,uint flags,MDB_dbi *dbi)

{
  uint *puVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  void *__n;
  char *__ptr;
  uint local_250;
  uint slot;
  MDB_node *node;
  uint16_t f2;
  size_t len;
  char *namedup;
  uint local_220;
  uint seq;
  uint unused;
  int exact;
  int dbflag;
  int rc;
  MDB_db dummy;
  MDB_cursor mc;
  undefined1 auStack_50 [4];
  MDB_dbi i;
  MDB_val data;
  MDB_val key;
  MDB_dbi *dbi_local;
  uint flags_local;
  char *name_local;
  MDB_txn *txn_local;
  
  local_220 = 0;
  if ((flags & 0xfffbff81) == 0) {
    if ((txn->mt_flags & 0x13) == 0) {
      if (name == (char *)0x0) {
        *dbi = 1;
        if (((flags & 0x7fff) != 0) &&
           (uVar2 = (ushort)flags & 0x7fff,
           (txn->mt_dbs[1].md_flags | uVar2) != txn->mt_dbs[1].md_flags)) {
          txn->mt_dbs[1].md_flags = txn->mt_dbs[1].md_flags | uVar2;
          txn->mt_flags = txn->mt_flags | 4;
        }
        mdb_default_cmp(txn,1);
        txn_local._4_4_ = 0;
      }
      else {
        if (txn->mt_dbxs[1].md_cmp == (MDB_cmp_func *)0x0) {
          mdb_default_cmp(txn,1);
        }
        __n = (void *)strlen(name);
        mc.mc_ki[0x1e] = 2;
        mc.mc_ki[0x1f] = 0;
        for (; (uint)mc.mc_ki._60_4_ < txn->mt_numdbs; mc.mc_ki._60_4_ = mc.mc_ki._60_4_ + 1) {
          if (txn->mt_dbxs[(uint)mc.mc_ki._60_4_].md_name.mv_size == 0) {
            if (local_220 == 0) {
              local_220._0_2_ = mc.mc_ki[0x1e];
              local_220._2_2_ = mc.mc_ki[0x1f];
            }
          }
          else if ((__n == (void *)txn->mt_dbxs[(uint)mc.mc_ki._60_4_].md_name.mv_size) &&
                  (iVar3 = strncmp(name,(char *)txn->mt_dbxs[(uint)mc.mc_ki._60_4_].md_name.mv_data,
                                   (size_t)__n), iVar3 == 0)) {
            *dbi = mc.mc_ki._60_4_;
            return 0;
          }
        }
        if ((local_220 == 0) && (txn->mt_env->me_maxdbs <= txn->mt_numdbs)) {
          txn_local._4_4_ = -0x7847;
        }
        else if ((txn->mt_dbs[1].md_flags & 0xc) == 0) {
          unused = 0x1c;
          seq = 0;
          data.mv_data = __n;
          mdb_cursor_init((MDB_cursor *)&dummy.md_root,txn,1,(MDB_xcursor *)0x0);
          exact = mdb_cursor_set((MDB_cursor *)&dummy.md_root,(MDB_val *)&data.mv_data,
                                 (MDB_val *)auStack_50,MDB_SET,(int *)&seq);
          if (exact == 0) {
            if ((*(ushort *)
                  ((long)mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1]->mp_ptrs +
                  (long)(int)(uint)mc.mc_pg[(ulong)mc.mc_dbflag._2_2_ - 1]->mp_ptrs
                                   [mc.mc_ki[(ulong)mc.mc_dbflag._2_2_ - 4]] + -0xc) & 6) != 2) {
              return -0x7840;
            }
          }
          else {
            if (exact != -0x784e) {
              return exact;
            }
            if ((flags & 0x40000) == 0) {
              return -0x784e;
            }
          }
          __ptr = strdup(name);
          if (__ptr == (char *)0x0) {
            txn_local._4_4_ = 0xc;
          }
          else {
            if (exact != 0) {
              _auStack_50 = 0x30;
              data.mv_size = (size_t)&dbflag;
              memset(&dbflag,0,0x30);
              dummy.md_entries = 0xffffffffffffffff;
              rc._0_2_ = (ushort)flags & 0x7fff;
              exact = mdb_cursor_put((MDB_cursor *)&dummy.md_root,(MDB_val *)&data.mv_data,
                                     (MDB_val *)auStack_50,2);
              unused = unused | 1;
            }
            if (exact == 0) {
              if (local_220 == 0) {
                local_250 = txn->mt_numdbs;
              }
              else {
                local_250 = local_220;
              }
              txn->mt_dbxs[local_250].md_name.mv_data = __ptr;
              txn->mt_dbxs[local_250].md_name.mv_size = (size_t)__n;
              txn->mt_dbxs[local_250].md_rel = (MDB_rel_func *)0x0;
              txn->mt_dbflags[local_250] = (uchar)unused;
              puVar1 = txn->mt_env->me_dbiseqs;
              uVar4 = puVar1[local_250] + 1;
              puVar1[local_250] = uVar4;
              txn->mt_dbiseqs[local_250] = uVar4;
              memcpy(txn->mt_dbs + local_250,(void *)data.mv_size,0x30);
              *dbi = local_250;
              mdb_default_cmp(txn,local_250);
              if (local_220 == 0) {
                txn->mt_numdbs = txn->mt_numdbs + 1;
              }
            }
            else {
              free(__ptr);
            }
            txn_local._4_4_ = exact;
          }
        }
        else {
          txn_local._4_4_ = -0x784e;
          if ((flags & 0x40000) != 0) {
            txn_local._4_4_ = -0x7840;
          }
        }
      }
    }
    else {
      txn_local._4_4_ = -0x783e;
    }
  }
  else {
    txn_local._4_4_ = 0x16;
  }
  return txn_local._4_4_;
}

Assistant:

int mdb_dbi_open(MDB_txn *txn, const char *name, unsigned int flags, MDB_dbi *dbi)
{
	MDB_val key, data;
	MDB_dbi i;
	MDB_cursor mc;
	MDB_db dummy;
	int rc, dbflag, exact;
	unsigned int unused = 0, seq;
	char *namedup;
	size_t len;

	if (flags & ~VALID_FLAGS)
		return EINVAL;
	if (txn->mt_flags & MDB_TXN_BLOCKED)
		return MDB_BAD_TXN;

	/* main DB? */
	if (!name) {
		*dbi = MAIN_DBI;
		if (flags & PERSISTENT_FLAGS) {
			uint16_t f2 = flags & PERSISTENT_FLAGS;
			/* make sure flag changes get committed */
			if ((txn->mt_dbs[MAIN_DBI].md_flags | f2) != txn->mt_dbs[MAIN_DBI].md_flags) {
				txn->mt_dbs[MAIN_DBI].md_flags |= f2;
				txn->mt_flags |= MDB_TXN_DIRTY;
			}
		}
		mdb_default_cmp(txn, MAIN_DBI);
		return MDB_SUCCESS;
	}

	if (txn->mt_dbxs[MAIN_DBI].md_cmp == NULL) {
		mdb_default_cmp(txn, MAIN_DBI);
	}

	/* Is the DB already open? */
	len = strlen(name);
	for (i=CORE_DBS; i<txn->mt_numdbs; i++) {
		if (!txn->mt_dbxs[i].md_name.mv_size) {
			/* Remember this free slot */
			if (!unused) unused = i;
			continue;
		}
		if (len == txn->mt_dbxs[i].md_name.mv_size &&
			!strncmp(name, txn->mt_dbxs[i].md_name.mv_data, len)) {
			*dbi = i;
			return MDB_SUCCESS;
		}
	}

	/* If no free slot and max hit, fail */
	if (!unused && txn->mt_numdbs >= txn->mt_env->me_maxdbs)
		return MDB_DBS_FULL;

	/* Cannot mix named databases with some mainDB flags */
	if (txn->mt_dbs[MAIN_DBI].md_flags & (MDB_DUPSORT|MDB_INTEGERKEY))
		return (flags & MDB_CREATE) ? MDB_INCOMPATIBLE : MDB_NOTFOUND;

	/* Find the DB info */
	dbflag = DB_NEW|DB_VALID|DB_USRVALID;
	exact = 0;
	key.mv_size = len;
	key.mv_data = (void *)name;
	mdb_cursor_init(&mc, txn, MAIN_DBI, NULL);
	rc = mdb_cursor_set(&mc, &key, &data, MDB_SET, &exact);
	if (rc == MDB_SUCCESS) {
		/* make sure this is actually a DB */
		MDB_node *node = NODEPTR(mc.mc_pg[mc.mc_top], mc.mc_ki[mc.mc_top]);
		if ((node->mn_flags & (F_DUPDATA|F_SUBDATA)) != F_SUBDATA)
			return MDB_INCOMPATIBLE;
	} else if (! (rc == MDB_NOTFOUND && (flags & MDB_CREATE))) {
		return rc;
	}

	/* Done here so we cannot fail after creating a new DB */
	if ((namedup = strdup(name)) == NULL)
		return ENOMEM;

	if (rc) {
		/* MDB_NOTFOUND and MDB_CREATE: Create new DB */
		data.mv_size = sizeof(MDB_db);
		data.mv_data = &dummy;
		memset(&dummy, 0, sizeof(dummy));
		dummy.md_root = P_INVALID;
		dummy.md_flags = flags & PERSISTENT_FLAGS;
		rc = mdb_cursor_put(&mc, &key, &data, F_SUBDATA);
		dbflag |= DB_DIRTY;
	}

	if (rc) {
		free(namedup);
	} else {
		/* Got info, register DBI in this txn */
		unsigned int slot = unused ? unused : txn->mt_numdbs;
		txn->mt_dbxs[slot].md_name.mv_data = namedup;
		txn->mt_dbxs[slot].md_name.mv_size = len;
		txn->mt_dbxs[slot].md_rel = NULL;
		txn->mt_dbflags[slot] = dbflag;
		/* txn-> and env-> are the same in read txns, use
		 * tmp variable to avoid undefined assignment
		 */
		seq = ++txn->mt_env->me_dbiseqs[slot];
		txn->mt_dbiseqs[slot] = seq;

		memcpy(&txn->mt_dbs[slot], data.mv_data, sizeof(MDB_db));
		*dbi = slot;
		mdb_default_cmp(txn, slot);
		if (!unused) {
			txn->mt_numdbs++;
		}
	}

	return rc;
}